

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O3

void __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Dump
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,FILE *stream,ui32_t depth)

{
  _List_node_base *p_Var1;
  char identbuf [128];
  FILE *local_108;
  char local_d8 [32];
  char local_b8 [136];
  
  local_108 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    local_108 = _stderr;
  }
  p_Var1 = (this->
           super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
           ).
           super__List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)
                &this->
                 super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
     ) {
    do {
      snprintf(local_d8,0x20,"%qu",p_Var1[2]._M_next);
      snprintf(local_b8,0x80,"%-6u: %s",(ulong)*(uint *)&p_Var1[1]._M_prev,local_d8);
      fprintf(local_108,"  %s\n",local_b8);
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)
                       &this->
                        super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
            );
  }
  return;
}

Assistant:

void Dump(FILE* stream = 0, ui32_t depth = 0)
	    {
	      (void) depth;
	      char identbuf[IdentBufferLen];

	      if ( stream == 0 )
		stream = stderr;

	      typename std::list<T>::iterator i = this->begin();
	      for ( ; i != this->end(); i++ )
		fprintf(stream, "  %s\n", (*i).EncodeString(identbuf, IdentBufferLen));
	    }